

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManCountChoiceNodes(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_28 = 0;
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    p_local._4_4_ = 0;
  }
  else {
    local_24 = 0;
    while( true ) {
      bVar3 = false;
      if (local_24 < p->nObjs) {
        pGVar2 = Gia_ManObj(p,local_24);
        bVar3 = pGVar2 != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ObjIsHead(p,local_24);
      local_28 = iVar1 + local_28;
      local_24 = local_24 + 1;
    }
    p_local._4_4_ = local_28;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManCountChoiceNodes( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pReprs == NULL || p->pNexts == NULL )
        return 0;
    Gia_ManForEachObj( p, pObj, i )
        Counter += Gia_ObjIsHead( p, i );
    return Counter;
}